

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::gamma_dist<double>::pdf(gamma_dist<double> *this,result_type_conflict2 x)

{
  result_type_conflict2 rVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __x;
  
  rVar1 = 0.0;
  if (0.0 <= x) {
    __x = x / (this->P).theta_;
    dVar4 = (this->P).kappa_;
    dVar2 = log(__x);
    dVar3 = lgamma((this->P).kappa_);
    dVar4 = exp((dVar2 * (dVar4 + -1.0) - __x) - dVar3);
    rVar1 = dVar4 / (this->P).theta_;
  }
  return rVar1;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      return math::exp((P.kappa() - 1) * math::ln(x) - x - math::ln_Gamma(P.kappa())) /
             (P.theta());
    }